

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O2

_Bool bson_iter_find_descendant(bson_iter_t *iter,char *dotkey,bson_iter_t *descendant)

{
  _Bool _Var1;
  bson_type_t bVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  undefined8 uVar6;
  int keylen;
  byte bVar7;
  bson_iter_t tmp;
  bson_iter_t abStack_100 [2];
  
  bVar7 = 0;
  if (iter == (bson_iter_t *)0x0) {
    pcVar3 = "iter";
    uVar6 = 0x175;
  }
  else if (dotkey == (char *)0x0) {
    pcVar3 = "dotkey";
    uVar6 = 0x176;
  }
  else {
    if (descendant != (bson_iter_t *)0x0) {
      pcVar3 = strchr(dotkey,0x2e);
      if (pcVar3 == (char *)0x0) {
        sVar4 = strlen(dotkey);
        keylen = (int)sVar4;
      }
      else {
        keylen = (int)pcVar3 - (int)dotkey;
      }
      _Var1 = _bson_iter_find_with_len(iter,dotkey,keylen);
      if (_Var1) {
        if (pcVar3 == (char *)0x0) {
          for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
            descendant->raw = iter->raw;
            iter = (bson_iter_t *)((long)iter + (ulong)bVar7 * -0x10 + 8);
            descendant = (bson_iter_t *)((long)descendant + (ulong)bVar7 * -0x10 + 8);
          }
          return true;
        }
        bVar2 = bson_iter_type(iter);
        if (((bVar2 == BSON_TYPE_DOCUMENT) ||
            (bVar2 = bson_iter_type(iter), bVar2 == BSON_TYPE_ARRAY)) &&
           (_Var1 = bson_iter_recurse(iter,abStack_100), _Var1)) {
          _Var1 = bson_iter_find_descendant(abStack_100,pcVar3 + 1,descendant);
          return _Var1;
        }
      }
      return false;
    }
    pcVar3 = "descendant";
    uVar6 = 0x177;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
          ,uVar6,"bson_iter_find_descendant",pcVar3);
  abort();
}

Assistant:

bool
bson_iter_find_descendant (bson_iter_t *iter,       /* INOUT */
                           const char *dotkey,      /* IN */
                           bson_iter_t *descendant) /* OUT */
{
   bson_iter_t tmp;
   const char *dot;
   size_t sublen;

   BSON_ASSERT (iter);
   BSON_ASSERT (dotkey);
   BSON_ASSERT (descendant);

   if ((dot = strchr (dotkey, '.'))) {
      sublen = dot - dotkey;
   } else {
      sublen = strlen (dotkey);
   }

   if (_bson_iter_find_with_len (iter, dotkey, (int) sublen)) {
      if (!dot) {
         *descendant = *iter;
         return true;
      }

      if (BSON_ITER_HOLDS_DOCUMENT (iter) || BSON_ITER_HOLDS_ARRAY (iter)) {
         if (bson_iter_recurse (iter, &tmp)) {
            return bson_iter_find_descendant (&tmp, dot + 1, descendant);
         }
      }
   }

   return false;
}